

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int num_exprs)

{
  SafeInt<int> SVar1;
  size_type __new_size;
  SafeInt<int> local_9c;
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> local_98;
  
  SafeInt<int>::SafeInt<unsigned_long>
            (&local_9c,
             ((long)(this->linear_exprs_).
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->linear_exprs_).
                   super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x78);
  SVar1 = operator+(local_9c,num_exprs);
  __new_size = (size_type)SVar1.value_;
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_98.m_data.m_storage;
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6
  ;
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::resize
            (&this->linear_exprs_,__new_size,(value_type *)&local_98);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::~small_vector_base
            (&local_98);
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)0x0;
  std::
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::resize(&this->nonlinear_exprs_,__new_size,(value_type *)&local_98);
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)CONCAT44(local_98.m_data.
                     super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr.
                     _4_4_,0x80000000);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->common_expr_positions_,__new_size,(value_type_conflict2 *)&local_98);
  return;
}

Assistant:

void AddCommonExprs(int num_exprs) {
    MP_ASSERT(num_exprs >= 0, "invalid size");
    std::size_t new_size = val(SafeInt<int>(linear_exprs_.size()) + num_exprs);
    linear_exprs_.resize(new_size, LinearExpr());
    nonlinear_exprs_.resize(new_size, NumericExpr());
    common_expr_positions_.resize(new_size, CommonExprPosDflt());
  }